

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.h
# Opt level: O3

shared_ptr<const_Rml::DecoratorDeclarationList> __thiscall
Rml::Property::Get<std::shared_ptr<Rml::DecoratorDeclarationList_const>>(Property *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Variant *in_RSI;
  shared_ptr<const_Rml::DecoratorDeclarationList> sVar1;
  shared_ptr<const_Rml::DecoratorDeclarationList> local_18;
  
  local_18.super___shared_ptr<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_18.super___shared_ptr<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Variant::GetInto<std::shared_ptr<const_Rml::DecoratorDeclarationList>,_0>(in_RSI,&local_18);
  (this->value).type =
       (Type)local_18.
             super___shared_ptr<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this->value).data =
       local_18.super___shared_ptr<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  sVar1.super___shared_ptr<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Rml::DecoratorDeclarationList>)
         sVar1.super___shared_ptr<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

T Get() const
	{
		return value.Get<T>();
	}